

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cdr.cpp
# Opt level: O0

Cdr * __thiscall
eprosima::fastcdr::Cdr::deserializeArray
          (Cdr *this,int32_t *long_t,size_t numElements,Endianness endianness)

{
  bool bVar1;
  uint8_t in_CL;
  Cdr *in_RDI;
  Exception *ex;
  bool auxSwap;
  int32_t *in_stack_00000048;
  Cdr *in_stack_00000050;
  bool local_42;
  bool local_41;
  
  bVar1 = in_RDI->m_swapBytes;
  if (((in_RDI->m_swapBytes & 1U) == 0) || (local_41 = true, in_RDI->m_endianness != in_CL)) {
    local_42 = false;
    if ((in_RDI->m_swapBytes & 1U) == 0) {
      local_42 = in_RDI->m_endianness != in_CL;
    }
    local_41 = local_42;
  }
  in_RDI->m_swapBytes = local_41;
  deserializeArray(in_stack_00000050,in_stack_00000048,(size_t)this);
  in_RDI->m_swapBytes = (bool)(bVar1 & 1);
  return in_RDI;
}

Assistant:

Cdr& Cdr::deserializeArray(int32_t *long_t, size_t numElements, Endianness endianness)
{
    bool auxSwap = m_swapBytes;
    m_swapBytes = (m_swapBytes && (m_endianness == endianness)) || (!m_swapBytes && (m_endianness != endianness));

    try
    {
        deserializeArray(long_t, numElements);
        m_swapBytes = auxSwap;
    }
    catch(Exception &ex)
    {
        m_swapBytes = auxSwap;
        ex.raise();
    }

    return *this;
}